

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_decompress_symbolic.cpp
# Opt level: O2

void decompress_symbolic_block
               (astcenc_profile decode_mode,block_size_descriptor *bsd,int xpos,int ypos,int zpos,
               symbolic_compressed_block *scb,image_block *blk)

{
  undefined4 uVar1;
  byte bVar2;
  byte bVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint8_t uVar16;
  int iVar17;
  uint uVar18;
  block_mode *pbVar19;
  undefined4 uVar20;
  ulong uVar21;
  ulong uVar22;
  uint8_t (*pauVar23) [216];
  int i_2;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_ZMM10 [64];
  vint4 ep1;
  vint4 ep0;
  int plane2_weights [216];
  int plane1_weights [216];
  bool local_7ea;
  bool local_7e9;
  partition_info *local_7e8;
  ulong local_7e0;
  undefined4 local_7d8;
  undefined4 uStack_7d4;
  undefined4 uStack_7d0;
  undefined4 uStack_7cc;
  undefined4 local_7c8;
  undefined4 uStack_7c4;
  undefined4 uStack_7c0;
  undefined4 uStack_7bc;
  undefined4 local_7b8;
  undefined4 uStack_7b4;
  undefined4 uStack_7b0;
  undefined4 uStack_7ac;
  undefined4 local_7a8;
  undefined4 uStack_7a4;
  undefined4 uStack_7a0;
  undefined4 uStack_79c;
  undefined4 local_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined1 local_788 [16];
  undefined1 local_778 [16];
  undefined4 local_768;
  undefined4 uStack_764;
  undefined4 uStack_760;
  undefined4 uStack_75c;
  undefined4 local_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 local_748;
  undefined4 uStack_744;
  undefined4 uStack_740;
  undefined4 uStack_73c;
  undefined4 local_738;
  undefined4 uStack_734;
  undefined4 uStack_730;
  undefined4 uStack_72c;
  undefined4 local_728;
  undefined4 uStack_724;
  undefined4 uStack_720;
  undefined4 uStack_71c;
  vint4 local_718;
  vint4 local_708;
  int local_6f8 [216];
  int local_398 [218];
  
  blk->xpos = xpos;
  blk->ypos = ypos;
  blk->zpos = zpos;
  blk->grayscale = false;
  (blk->data_min).m[0] = 0.0;
  (blk->data_min).m[1] = 0.0;
  (blk->data_min).m[2] = 0.0;
  (blk->data_min).m[3] = 0.0;
  (blk->data_mean).m[0] = 0.0;
  (blk->data_mean).m[1] = 0.0;
  (blk->data_mean).m[2] = 0.0;
  (blk->data_mean).m[3] = 0.0;
  (blk->data_mean).m[0] = 0.0;
  (blk->data_mean).m[1] = 0.0;
  (blk->data_mean).m[2] = 0.0;
  (blk->data_mean).m[3] = 0.0;
  (blk->data_max).m[0] = 0.0;
  (blk->data_max).m[1] = 0.0;
  (blk->data_max).m[2] = 0.0;
  (blk->data_max).m[3] = 0.0;
  uVar16 = scb->block_type;
  auVar25 = in_ZMM1._0_16_;
  if (uVar16 == '\x02') {
    auVar32 = vpsrad_avx(*(undefined1 (*) [16])&scb->field_9,8);
    auVar34._8_4_ = 0x101;
    auVar34._0_8_ = 0x10100000101;
    auVar34._12_4_ = 0x101;
    auVar25 = vpcmpeqd_avx(auVar25,auVar25);
    auVar28 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
    if (blk->decode_unorm8 == false) {
      auVar28 = (undefined1  [16])0x0;
    }
    auVar32 = vpmulld_avx(auVar32,auVar34);
    if (decode_mode != ASTCENC_PRF_LDR_SRGB) {
      auVar25 = auVar28;
    }
    auVar28 = vpblendvb_avx(*(undefined1 (*) [16])&scb->field_9,auVar32,auVar25);
    auVar25 = vpsrld_avx(auVar28,8);
    auVar25 = vpandn_avx(auVar25,auVar28);
    auVar25 = vcvtdq2ps_avx(auVar25);
    auVar32._8_4_ = 0x9e;
    auVar32._0_8_ = 0x9e0000009e;
    auVar32._12_4_ = 0x9e;
    auVar25 = vpsrld_avx(auVar25,0x17);
    auVar25 = vpsubd_avx(auVar32,auVar25);
    auVar25 = vpmaxsd_avx(auVar25,(undefined1  [16])0x0);
    auVar38._8_4_ = 0x20;
    auVar38._0_8_ = 0x2000000020;
    auVar38._12_4_ = 0x20;
    auVar26._8_4_ = 3;
    auVar26._0_8_ = 0x300000003;
    auVar26._12_4_ = 3;
    auVar38 = vpminsd_avx(auVar25,auVar38);
    auVar34 = vpcmpgtd_avx(auVar28,auVar26);
    auVar25._8_4_ = 0xffff;
    auVar25._0_8_ = 0xffff0000ffff;
    auVar25._12_4_ = 0xffff;
    auVar32 = vpcmpeqd_avx(auVar28,auVar25);
    auVar25 = vpslld_avx(auVar38,0x17);
    auVar35._8_4_ = 0x38000000;
    auVar35._0_8_ = 0x3800000038000000;
    auVar35._12_4_ = 0x38000000;
    auVar25 = vpaddd_avx(auVar25,auVar35);
    auVar29._0_4_ = (int)auVar25._0_4_;
    auVar29._4_4_ = (int)auVar25._4_4_;
    auVar29._8_4_ = (int)auVar25._8_4_;
    auVar29._12_4_ = (int)auVar25._12_4_;
    auVar25 = vpmulld_avx(auVar29,auVar28);
    auVar25 = vpsrld_avx(auVar25,6);
    auVar38 = vpslld_avx(auVar38,10);
    auVar36._8_4_ = 0x3ff;
    auVar36._0_8_ = 0x3ff000003ff;
    auVar36._12_4_ = 0x3ff;
    auVar25 = vpand_avx(auVar25,auVar36);
    auVar25 = vpsubd_avx(auVar25,auVar38);
    auVar44._8_4_ = 0x7800;
    auVar44._0_8_ = 0x780000007800;
    auVar44._12_4_ = 0x7800;
    auVar25 = vpaddd_avx(auVar25,auVar44);
    auVar30._8_4_ = 0x3c00;
    auVar30._0_8_ = 0x3c0000003c00;
    auVar30._12_4_ = 0x3c00;
    auVar25 = vblendvps_avx(auVar25,auVar30,auVar32);
    auVar28 = vpslld_avx(auVar28,8);
    auVar25 = vblendvps_avx(auVar28,auVar25,auVar34);
    uVar16 = '\0';
  }
  else {
    if (uVar16 != '\x01') {
      if (uVar16 == '\0') {
        for (uVar21 = 0; uVar21 < bsd->texel_count; uVar21 = uVar21 + 1) {
          blk->data_r[uVar21] = -NAN;
          blk->data_g[uVar21] = -NAN;
          blk->data_b[uVar21] = -NAN;
          blk->data_a[uVar21] = -NAN;
          blk->rgb_lns[uVar21] = '\0';
          blk->alpha_lns[uVar21] = '\0';
        }
        return;
      }
      local_7e0 = (ulong)scb->partition_count;
      auVar28 = in_ZMM10._0_16_;
      local_7e8 = block_size_descriptor::get_partition_info
                            (bsd,(uint)scb->partition_count,(uint)scb->partition_index);
      pbVar19 = block_size_descriptor::get_block_mode(bsd,(uint)scb->block_mode);
      unpack_weights(bsd,scb,bsd->decimation_tables + pbVar19->decimation_mode,
                     (bool)(pbVar19->field_0x5 & 1),local_398,local_6f8);
      iVar17 = (int)scb->plane2_component;
      local_778 = vpcmpeqd_avx(auVar28,auVar28);
      auVar25 = vpcmpeqd_avx(auVar25,auVar25);
      if (blk->decode_unorm8 == false) {
        auVar25 = (undefined1  [16])0x0;
      }
      auVar28._4_4_ = iVar17;
      auVar28._0_4_ = iVar17;
      auVar28._8_4_ = iVar17;
      auVar28._12_4_ = iVar17;
      if (decode_mode != ASTCENC_PRF_LDR_SRGB) {
        local_778 = auVar25;
      }
      pauVar23 = local_7e8->texels_of_partition;
      uVar21 = 0;
      local_788 = vpcmpeqd_avx(auVar28,_DAT_002f8df0);
      local_7d8 = 3;
      uStack_7d4 = 3;
      uStack_7d0 = 3;
      uStack_7cc = 3;
      local_728 = 0xffff;
      uStack_724 = 0xffff;
      uStack_720 = 0xffff;
      uStack_71c = 0xffff;
      local_738 = 0x38000000;
      uStack_734 = 0x38000000;
      uStack_730 = 0x38000000;
      uStack_72c = 0x38000000;
      local_748 = 0x3ff;
      uStack_744 = 0x3ff;
      uStack_740 = 0x3ff;
      uStack_73c = 0x3ff;
      local_758 = 0x7800;
      uStack_754 = 0x7800;
      uStack_750 = 0x7800;
      uStack_74c = 0x7800;
      local_768 = 0x3c00;
      uStack_764 = 0x3c00;
      uStack_760 = 0x3c00;
      uStack_75c = 0x3c00;
      local_798 = 0x40;
      uStack_794 = 0x40;
      uStack_790 = 0x40;
      uStack_78c = 0x40;
      local_7a8 = 0x20;
      uStack_7a4 = 0x20;
      uStack_7a0 = 0x20;
      uStack_79c = 0x20;
      local_7b8 = 0x101;
      uStack_7b4 = 0x101;
      uStack_7b0 = 0x101;
      uStack_7ac = 0x101;
      local_7c8 = 0x9e;
      uStack_7c4 = 0x9e;
      uStack_7c0 = 0x9e;
      uStack_7bc = 0x9e;
      do {
        if (uVar21 == local_7e0) {
          return;
        }
        unpack_color_endpoints
                  (decode_mode,(uint)scb->color_formats[uVar21],
                   scb->color_formats + uVar21 * 8 + 0xc,&local_7e9,&local_7ea,&local_708,&local_718
                  );
        auVar7._4_4_ = uStack_7c4;
        auVar7._0_4_ = local_7c8;
        auVar7._8_4_ = uStack_7c0;
        auVar7._12_4_ = uStack_7bc;
        auVar8._4_4_ = uStack_7b4;
        auVar8._0_4_ = local_7b8;
        auVar8._8_4_ = uStack_7b0;
        auVar8._12_4_ = uStack_7ac;
        auVar9._4_4_ = uStack_7a4;
        auVar9._0_4_ = local_7a8;
        auVar9._8_4_ = uStack_7a0;
        auVar9._12_4_ = uStack_79c;
        auVar10._4_4_ = uStack_794;
        auVar10._0_4_ = local_798;
        auVar10._8_4_ = uStack_790;
        auVar10._12_4_ = uStack_78c;
        uVar18 = -(uint)local_7e9;
        auVar25 = vpinsrd_avx(ZEXT416(uVar18),uVar18,1);
        auVar25 = vpinsrd_avx(auVar25,uVar18,2);
        auVar25 = vpinsrd_avx(auVar25,-(uint)local_7ea,3);
        bVar2 = local_7e8->partition_texel_count[uVar21];
        uVar20 = vmovmskps_avx(auVar25);
        for (uVar22 = 0; bVar2 != uVar22; uVar22 = uVar22 + 1) {
          bVar3 = (*pauVar23)[uVar22];
          uVar1 = *(undefined4 *)((long)local_398 + (ulong)((uint)bVar3 * 4));
          auVar27._4_4_ = uVar1;
          auVar27._0_4_ = uVar1;
          auVar27._8_4_ = uVar1;
          auVar27._12_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)local_6f8 + (ulong)((uint)bVar3 * 4));
          auVar31._4_4_ = uVar1;
          auVar31._0_4_ = uVar1;
          auVar31._8_4_ = uVar1;
          auVar31._12_4_ = uVar1;
          auVar28 = vblendvps_avx(auVar27,auVar31,local_788);
          auVar32 = vpsubd_avx(auVar10,auVar28);
          auVar32 = vpmulld_avx(auVar32,(undefined1  [16])local_708.m);
          auVar28 = vpmulld_avx(auVar28,(undefined1  [16])local_718.m);
          auVar28 = vpaddd_avx(auVar9,auVar28);
          auVar28 = vpaddd_avx(auVar28,auVar32);
          auVar32 = vpsrad_avx(auVar28,6);
          auVar28 = vpsrad_avx(auVar28,0xe);
          auVar28 = vpmulld_avx(auVar28,auVar8);
          auVar28 = vpblendvb_avx(auVar32,auVar28,local_778);
          if ((char)uVar20 == '\0') {
            auVar32 = (undefined1  [16])0x0;
LAB_00257deb:
            auVar34 = vpsrld_avx(auVar28,8);
            auVar34 = vpandn_avx(auVar34,auVar28);
            auVar34 = vcvtdq2ps_avx(auVar34);
            auVar34 = vpsrld_avx(auVar34,0x17);
            auVar34 = vpsubd_avx(auVar7,auVar34);
            auVar34 = vpmaxsd_avx(auVar34,_DAT_00264480);
            auVar29 = vpminsd_avx(auVar34,auVar9);
            auVar6._4_4_ = uStack_7d4;
            auVar6._0_4_ = local_7d8;
            auVar6._8_4_ = uStack_7d0;
            auVar6._12_4_ = uStack_7cc;
            auVar26 = vpcmpgtd_avx(auVar28,auVar6);
            auVar15._4_4_ = uStack_724;
            auVar15._0_4_ = local_728;
            auVar15._8_4_ = uStack_720;
            auVar15._12_4_ = uStack_71c;
            auVar38 = vpcmpeqd_avx(auVar28,auVar15);
            auVar44 = vpslld_avx(auVar28,8);
            auVar34 = vpslld_avx(auVar29,0x17);
            auVar14._4_4_ = uStack_734;
            auVar14._0_4_ = local_738;
            auVar14._8_4_ = uStack_730;
            auVar14._12_4_ = uStack_72c;
            auVar34 = vpaddd_avx(auVar34,auVar14);
            auVar46._0_4_ = (int)auVar34._0_4_;
            auVar46._4_4_ = (int)auVar34._4_4_;
            auVar46._8_4_ = (int)auVar34._8_4_;
            auVar46._12_4_ = (int)auVar34._12_4_;
            auVar28 = vpmulld_avx(auVar46,auVar28);
            auVar28 = vpsrld_avx(auVar28,6);
            auVar13._4_4_ = uStack_744;
            auVar13._0_4_ = local_748;
            auVar13._8_4_ = uStack_740;
            auVar13._12_4_ = uStack_73c;
            auVar28 = vpand_avx(auVar28,auVar13);
            auVar34 = vpslld_avx(auVar29,10);
            auVar28 = vpsubd_avx(auVar28,auVar34);
            auVar12._4_4_ = uStack_754;
            auVar12._0_4_ = local_758;
            auVar12._8_4_ = uStack_750;
            auVar12._12_4_ = uStack_74c;
            auVar28 = vpaddd_avx(auVar28,auVar12);
            auVar11._4_4_ = uStack_764;
            auVar11._0_4_ = local_768;
            auVar11._8_4_ = uStack_760;
            auVar11._12_4_ = uStack_75c;
            auVar28 = vblendvps_avx(auVar28,auVar11,auVar38);
            auVar28 = vblendvps_avx(auVar44,auVar28,auVar26);
          }
          else {
            auVar33._8_4_ = 0x7ff;
            auVar33._0_8_ = 0x7ff000007ff;
            auVar33._12_4_ = 0x7ff;
            auVar34 = vpand_avx(auVar28,auVar33);
            auVar37._8_4_ = 0x1ff;
            auVar37._0_8_ = 0x1ff000001ff;
            auVar37._12_4_ = 0x1ff;
            auVar38 = vpcmpgtd_avx(auVar34,auVar37);
            auVar32 = vpslld_avx(auVar34,2);
            auVar41._8_4_ = 0xfffffe00;
            auVar41._0_8_ = 0xfffffe00fffffe00;
            auVar41._12_4_ = 0xfffffe00;
            auVar32 = vpaddd_avx(auVar32,auVar41);
            auVar42._8_4_ = 0x5ff;
            auVar42._0_8_ = 0x5ff000005ff;
            auVar42._12_4_ = 0x5ff;
            auVar43._8_2_ = 5;
            auVar43._0_8_ = 0x5000500050005;
            auVar43._10_2_ = 5;
            auVar43._12_2_ = 5;
            auVar43._14_2_ = 5;
            auVar26 = vpcmpgtd_avx(auVar34,auVar42);
            auVar29 = vpmaddwd_avx(auVar43,auVar34);
            auVar45._8_4_ = 0xfffff800;
            auVar45._0_8_ = 0xfffff800fffff800;
            auVar45._12_4_ = 0xfffff800;
            auVar5._4_4_ = uStack_7d4;
            auVar5._0_4_ = local_7d8;
            auVar5._8_4_ = uStack_7d0;
            auVar5._12_4_ = uStack_7cc;
            auVar44 = vpmaddwd_avx(auVar34,auVar5);
            auVar34 = vpaddd_avx(auVar29,auVar45);
            auVar32 = vblendvps_avx(auVar32,auVar34,auVar26);
            auVar32 = vblendvps_avx(auVar44,auVar32,auVar38);
            auVar38 = vpsrld_avx(auVar28,1);
            auVar34 = vpsrld_avx(auVar32,3);
            auVar40._8_4_ = 0x7ffffc00;
            auVar40._0_8_ = 0x7ffffc007ffffc00;
            auVar40._12_4_ = 0x7ffffc00;
            auVar32 = vpand_avx(auVar38,auVar40);
            auVar32 = vpor_avx(auVar34,auVar32);
            auVar39._8_4_ = 0x7bff;
            auVar39._0_8_ = 0x7bff00007bff;
            auVar39._12_4_ = 0x7bff;
            auVar32 = vpminud_avx(auVar32,auVar39);
            if ((char)uVar20 != '\x0f') goto LAB_00257deb;
            auVar28 = (undefined1  [16])0x0;
          }
          auVar28 = vpblendvb_avx(auVar28,auVar32,auVar25);
          auVar28 = vpackssdw_avx(auVar28,auVar28);
          auVar28 = vcvtph2ps_f16c(auVar28);
          blk->data_r[bVar3] = auVar28._0_4_;
          fVar4 = (float)vextractps_avx(auVar28,1);
          blk->data_g[bVar3] = fVar4;
          fVar4 = (float)vextractps_avx(auVar28,2);
          blk->data_b[bVar3] = fVar4;
          fVar4 = (float)vextractps_avx(auVar28,3);
          blk->data_a[bVar3] = fVar4;
        }
        uVar21 = uVar21 + 1;
        pauVar23 = pauVar23 + 1;
      } while( true );
    }
    if ((decode_mode & ~ASTCENC_PRF_LDR) != ASTCENC_PRF_HDR_RGB_LDR_A) {
      auVar24._8_4_ = 0xffffe000;
      auVar24._0_8_ = 0xffffe000ffffe000;
      auVar24._12_4_ = 0xffffe000;
      uVar16 = '\0';
      goto LAB_00257ec4;
    }
    auVar25 = *(undefined1 (*) [16])&scb->field_9;
    uVar16 = '\x01';
  }
  auVar25 = vpackssdw_avx(auVar25,auVar25);
  auVar24 = vcvtph2ps_f16c(auVar25);
LAB_00257ec4:
  auVar25 = vmovshdup_avx(auVar24);
  auVar28 = vshufpd_avx(auVar24,auVar24,1);
  auVar32 = vshufps_avx(auVar24,auVar24,0xff);
  for (uVar21 = 0; uVar21 < bsd->texel_count; uVar21 = uVar21 + 1) {
    blk->data_r[uVar21] = auVar24._0_4_;
    blk->data_g[uVar21] = auVar25._0_4_;
    blk->data_b[uVar21] = auVar28._0_4_;
    blk->data_a[uVar21] = auVar32._0_4_;
    blk->rgb_lns[uVar21] = uVar16;
    blk->alpha_lns[uVar21] = uVar16;
  }
  return;
}

Assistant:

void decompress_symbolic_block(
	astcenc_profile decode_mode,
	const block_size_descriptor& bsd,
	int xpos,
	int ypos,
	int zpos,
	const symbolic_compressed_block& scb,
	image_block& blk
) {
	blk.xpos = xpos;
	blk.ypos = ypos;
	blk.zpos = zpos;

	blk.data_min = vfloat4::zero();
	blk.data_mean = vfloat4::zero();
	blk.data_max = vfloat4::zero();
	blk.grayscale = false;

	// If we detected an error-block, blow up immediately.
	if (scb.block_type == SYM_BTYPE_ERROR)
	{
		for (unsigned int i = 0; i < bsd.texel_count; i++)
		{
			blk.data_r[i] = error_color_nan();
			blk.data_g[i] = error_color_nan();
			blk.data_b[i] = error_color_nan();
			blk.data_a[i] = error_color_nan();
			blk.rgb_lns[i] = 0;
			blk.alpha_lns[i] = 0;
		}

		return;
	}

	if ((scb.block_type == SYM_BTYPE_CONST_F16) ||
	    (scb.block_type == SYM_BTYPE_CONST_U16))
	{
		vfloat4 color;
		uint8_t use_lns = 0;

		// UNORM16 constant color block
		if (scb.block_type == SYM_BTYPE_CONST_U16)
		{
			vint4 colori(scb.constant_color);

			// Determine the UNORM8 rounding on the decode
			vmask4 u8_mask = get_u8_component_mask(decode_mode, blk);

			// The real decoder would just use the top 8 bits, but we rescale
			// in to a 16-bit value that rounds correctly.
			vint4 colori_u8 = asr<8>(colori) * 257;
			colori = select(colori, colori_u8, u8_mask);

			vint4 colorf16 = unorm16_to_sf16(colori);
			color = float16_to_float(colorf16);
		}
		// FLOAT16 constant color block
		else
		{
			switch (decode_mode)
			{
			case ASTCENC_PRF_LDR_SRGB:
			case ASTCENC_PRF_LDR:
				color = vfloat4(error_color_nan());
				break;
			case ASTCENC_PRF_HDR_RGB_LDR_A:
			case ASTCENC_PRF_HDR:
				// Constant-color block; unpack from FP16 to FP32.
				color = float16_to_float(vint4(scb.constant_color));
				use_lns = 1;
				break;
			}
		}

		for (unsigned int i = 0; i < bsd.texel_count; i++)
		{
			blk.data_r[i] = color.lane<0>();
			blk.data_g[i] = color.lane<1>();
			blk.data_b[i] = color.lane<2>();
			blk.data_a[i] = color.lane<3>();
			blk.rgb_lns[i] = use_lns;
			blk.alpha_lns[i] = use_lns;
		}

		return;
	}

	// Get the appropriate partition-table entry
	int partition_count = scb.partition_count;
	const auto& pi = bsd.get_partition_info(partition_count, scb.partition_index);

	// Get the appropriate block descriptors
	const auto& bm = bsd.get_block_mode(scb.block_mode);
	const auto& di = bsd.get_decimation_info(bm.decimation_mode);

	bool is_dual_plane = static_cast<bool>(bm.is_dual_plane);

	// Unquantize and undecimate the weights
	int plane1_weights[BLOCK_MAX_TEXELS];
	int plane2_weights[BLOCK_MAX_TEXELS];
	unpack_weights(bsd, scb, di, is_dual_plane, plane1_weights, plane2_weights);

	// Now that we have endpoint colors and weights, we can unpack texel colors
	int plane2_component = scb.plane2_component;
	vmask4 plane2_mask = vint4::lane_id() == vint4(plane2_component);

	vmask4 u8_mask = get_u8_component_mask(decode_mode, blk);

	for (int i = 0; i < partition_count; i++)
	{
		// Decode the color endpoints for this partition
		vint4 ep0;
		vint4 ep1;
		bool rgb_lns;
		bool a_lns;

		unpack_color_endpoints(decode_mode,
		                       scb.color_formats[i],
		                       scb.color_values[i],
		                       rgb_lns, a_lns,
		                       ep0, ep1);

		vmask4 lns_mask(rgb_lns, rgb_lns, rgb_lns, a_lns);

		int texel_count = pi.partition_texel_count[i];
		for (int j = 0; j < texel_count; j++)
		{
			int tix = pi.texels_of_partition[i][j];
			vint4 weight = select(vint4(plane1_weights[tix]), vint4(plane2_weights[tix]), plane2_mask);
			vint4 color = lerp_color_int(u8_mask, ep0, ep1, weight);
			vfloat4 colorf = decode_texel(color, lns_mask);

			blk.data_r[tix] = colorf.lane<0>();
			blk.data_g[tix] = colorf.lane<1>();
			blk.data_b[tix] = colorf.lane<2>();
			blk.data_a[tix] = colorf.lane<3>();
		}
	}
}